

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPML_ECC_CURVE_Unmarshal(TPML_ECC_CURVE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(&target->count,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0x84;
    if (target->count < 0x1fd) {
      TVar1 = TPM_ECC_CURVE_Array_Unmarshal(target->eccCurves,buffer,size,target->count);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPML_ECC_CURVE_Unmarshal(TPML_ECC_CURVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > MAX_ECC_CURVES)
        return TPM_RC_VALUE;
    result = TPM_ECC_CURVE_Array_Unmarshal((TPM_ECC_CURVE *)(target->eccCurves), buffer, size, (INT32)(target->count));
    return result;
}